

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

String * File::getAbsolutePath(String *__return_storage_ptr__,String *path)

{
  bool bVar1;
  
  bVar1 = isAbsolutePath(path);
  if (bVar1) {
    String::String(__return_storage_ptr__,path);
  }
  else {
    Directory::getCurrentDirectory();
    String::reserve(__return_storage_ptr__,__return_storage_ptr__->data->len + path->data->len + 1);
    String::append(__return_storage_ptr__,'/');
    String::append(__return_storage_ptr__,path);
  }
  return __return_storage_ptr__;
}

Assistant:

String File::getAbsolutePath(const String& path)
{
  if(isAbsolutePath(path))
    return path;
  String result = Directory::getCurrentDirectory();
  result.reserve(result.length() + 1 + path.length());
  result.append('/');
  result.append(path);
  return result;
}